

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

bool __thiscall TextBuffer::deserialize_changes(TextBuffer *this,Deserializer *deserializer)

{
  byte bVar1;
  Layer *previous_layer;
  byte *pbVar2;
  bool bVar3;
  Layer *this_00;
  int iVar4;
  uint32_t uVar5;
  byte *pbVar6;
  Patch local_60;
  
  previous_layer = this->base_layer;
  if ((this->top_layer == previous_layer) && (previous_layer->previous_layer == (Layer *)0x0)) {
    this_00 = (Layer *)operator_new(0xa0);
    Layer::Layer(this_00,previous_layer);
    this->top_layer = this_00;
    pbVar2 = *(byte **)deserializer;
    if ((*(int *)(deserializer + 8) - (int)pbVar2 & 0xfffffffcU) == 0) {
      uVar5 = 0;
    }
    else {
      iVar4 = 0;
      uVar5 = 0;
      pbVar6 = pbVar2;
      do {
        bVar1 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar5 = uVar5 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
        iVar4 = iVar4 + 8;
      } while (iVar4 != 0x20);
    }
    *(byte **)deserializer = pbVar2 + 4;
    this_00->size_ = uVar5;
    Point::Point((Point *)&local_60,deserializer);
    this->top_layer->extent_ = (Point)local_60.root;
    Patch::Patch(&local_60,deserializer);
    Patch::operator=(&this->top_layer->patch,&local_60);
    Patch::~Patch(&local_60);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool TextBuffer::deserialize_changes(Deserializer &deserializer) {
  if (top_layer != base_layer || base_layer->previous_layer) return false;
  top_layer = new Layer(base_layer);
  top_layer->size_ = deserializer.read<uint32_t>();
  top_layer->extent_ = Point(deserializer);
  top_layer->patch = Patch(deserializer);
  return true;
}